

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

bool __thiscall RenX_CommandsPlugin::initialize(RenX_CommandsPlugin *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  string *psVar5;
  duration<long,_std::ratio<1L,_1L>_> dVar6;
  const_iterator cVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> dVar10;
  basic_string_view<char,_std::char_traits<char>_> *args_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined1 local_80 [32];
  basic_string_view<char,_std::char_traits<char>_> local_60;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  puVar1 = &this->field_0x38;
  auVar8 = Jupiter::Config::get(puVar1,0xf,"DefaultTBanTime",2,"1d");
  auVar9 = Jupiter::Config::get(puVar1,0xb,"MaxTBanTime",2,"1w");
  dVar10 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                     (auVar8._8_8_,auVar8._8_8_ + auVar8._0_8_);
  (this->m_defaultTempBanTime).__r = dVar10.duration.__r.__r;
  dVar10 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                     (auVar9._8_8_,auVar9._8_8_ + auVar9._0_8_);
  dVar6.__r = (this->m_defaultTempBanTime).__r;
  if (dVar6.__r < dVar10.duration.__r.__r) {
    dVar6.__r = dVar10.duration.__r.__r;
  }
  (this->m_maxTempBanTime).__r = dVar6.__r;
  auVar8 = Jupiter::Config::get
                     (puVar1,0x10,"PlayerInfoFormat",0xc4,
                      "\x0303[Player Info]\x03{TCOLOR} \x02{RNAME}\x02 - ID: {ID} - Team: \x02{TEAML}\x02 - Vehicle Kills: {VEHICLEKILLS} - Building Kills {BUILDINGKILLS} - Kills {KILLS} - Deaths: {DEATHS} - KDR: {KDR} - Access: {ACCESS}"
                     );
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_playerInfoFormat,0,(this->m_playerInfoFormat)._M_string_length,auVar8._8_8_,
             auVar8._0_8_);
  paVar2 = &__str.field_2;
  pcVar4 = (this->m_playerInfoFormat)._M_dataplus._M_p;
  __str._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,pcVar4,pcVar4 + (this->m_playerInfoFormat)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&__str,
             " - IP: \x02{IP}\x02 - HWID: \x02{HWID}\x02 - RDNS: \x02{RDNS}\x02 - Steam ID: \x02{STEAM}"
            );
  local_90._M_len = 0x15;
  local_90._M_str = "AdminPlayerInfoFormat";
  cVar7 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_90);
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p == paVar2) {
      local_f8.field_2._8_8_ = __str.field_2._8_8_;
    }
    else {
      local_f8._M_dataplus._M_p = __str._M_dataplus._M_p;
    }
    local_f8.field_2._M_allocated_capacity._1_7_ = __str.field_2._M_allocated_capacity._1_7_;
    local_f8.field_2._M_local_buf[0] = __str.field_2._M_local_buf[0];
    local_f8._M_string_length = __str._M_string_length;
    __str._M_string_length = 0;
    __str.field_2._M_local_buf[0] = '\0';
    __str._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               *(long *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28),
               *(long *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30) +
               *(long *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28));
  }
  args_7 = (basic_string_view<char,_std::char_traits<char>_> *)0x123951;
  local_98 = (string *)&this->m_playerInfoFormat;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_adminPlayerInfoFormat,&local_f8);
  paVar3 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    args_7 = (basic_string_view<char,_std::char_traits<char>_> *)0x12396c;
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar2) {
    args_7 = (basic_string_view<char,_std::char_traits<char>_> *)0x123983;
    operator_delete(__str._M_dataplus._M_p,
                    CONCAT71(__str.field_2._M_allocated_capacity._1_7_,__str.field_2._M_local_buf[0]
                            ) + 1);
  }
  local_40._M_allocated_capacity = 1;
  local_40._8_8_ =
       (long)
       "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game! Reason: %.*s\x03"
       + 0x4b;
  local_50._0_8_ = (pointer)0x1;
  local_50._8_8_ = "\x03";
  local_60._M_len = 3;
  local_60._M_str = " - ";
  local_80._16_8_ = 3;
  local_80._24_8_ = "\x0307";
  local_80._0_8_ = (pointer)0x1;
  local_80._8_8_ = "%";
  jessilib::
  join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
            (&local_b8,(jessilib *)(local_50 + 0x10),
             (basic_string_view<char,_std::char_traits<char>_> *)(RenX::tags + 0x2568),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (RenX::tags + 0x2408),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,&local_60
             ,(basic_string_view<char,_std::char_traits<char>_> *)(local_80 + 0x10),
             (basic_string_view<char,_std::char_traits<char>_> *)(RenX::tags + 0x2488),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,args_7);
  local_90._M_len = 0x12;
  local_90._M_str = "BuildingInfoFormat";
  cVar7 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->field_0x60,&local_90);
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  if (cVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      local_f8.field_2._8_8_ = local_b8.field_2._8_8_;
    }
    else {
      local_f8._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    }
    local_f8.field_2._M_allocated_capacity._1_7_ = local_b8.field_2._M_allocated_capacity._1_7_;
    local_f8.field_2._M_local_buf[0] = local_b8.field_2._M_local_buf[0];
    local_f8._M_string_length = local_b8._M_string_length;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               *(long *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28),
               *(long *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x30) +
               *(long *)((long)cVar7.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                               ._M_cur + 0x28));
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_buildingInfoFormat,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  psVar5 = local_98;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  auVar8 = Jupiter::Config::get(puVar1,10,"StaffTitle",9,"Moderator");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->m_staffTitle,0,(this->m_staffTitle)._M_string_length,auVar8._8_8_,auVar8._0_8_);
  RenX::sanitizeTags(psVar5);
  RenX::sanitizeTags((string *)&this->m_adminPlayerInfoFormat);
  RenX::sanitizeTags((string *)&this->m_buildingInfoFormat);
  return true;
}

Assistant:

bool RenX_CommandsPlugin::initialize() {
	auto default_tban_time = this->config.get("DefaultTBanTime"sv, "1d"sv);
	auto max_tban_time = this->config.get("MaxTBanTime"sv, "1w"sv);
	m_defaultTempBanTime = jessilib::duration_from_string(default_tban_time.data(), default_tban_time.data() + default_tban_time.size()).duration;
	m_maxTempBanTime = std::max(jessilib::duration_from_string(max_tban_time.data(), max_tban_time.data() + max_tban_time.size()).duration, m_defaultTempBanTime);
	m_playerInfoFormat = this->config.get("PlayerInfoFormat"sv, IRCCOLOR "03[Player Info]" IRCCOLOR "{TCOLOR} " IRCBOLD "{RNAME}" IRCBOLD " - ID: {ID} - Team: " IRCBOLD "{TEAML}" IRCBOLD " - Vehicle Kills: {VEHICLEKILLS} - Building Kills {BUILDINGKILLS} - Kills {KILLS} - Deaths: {DEATHS} - KDR: {KDR} - Access: {ACCESS}"sv);
	m_adminPlayerInfoFormat = this->config.get("AdminPlayerInfoFormat"sv, m_playerInfoFormat + " - IP: " IRCBOLD "{IP}" IRCBOLD " - HWID: " IRCBOLD "{HWID}" IRCBOLD " - RDNS: " IRCBOLD "{RDNS}" IRCBOLD " - Steam ID: " IRCBOLD "{STEAM}");
	m_buildingInfoFormat = this->config.get("BuildingInfoFormat"sv, jessilib::join<std::string>(""sv IRCCOLOR, RenX::tags->buildingTeamColorTag, RenX::tags->buildingNameTag, ""sv IRCCOLOR, " - "sv, IRCCOLOR "07"sv, RenX::tags->buildingHealthPercentageTag, "%"sv));
	m_staffTitle = this->config.get("StaffTitle"sv, "Moderator"sv);

	RenX::sanitizeTags(m_playerInfoFormat);
	RenX::sanitizeTags(m_adminPlayerInfoFormat);
	RenX::sanitizeTags(m_buildingInfoFormat);
	return true;
}